

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O3

color_quad_u8 __thiscall
crnd::dxt1_block::unpack_color(dxt1_block *this,uint16 packed_color,bool scaled,uint32 alpha)

{
  uint32 uVar1;
  undefined7 in_register_00000011;
  uint8 uVar2;
  undefined6 in_register_00000032;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  byte bVar6;
  
  uVar3 = CONCAT62(in_register_00000032,packed_color);
  uVar4 = (uint)uVar3 & 0x1f;
  uVar5 = (uint)(uVar3 >> 5) & 0x3f;
  uVar3 = uVar3 >> 0xb & 0x1fffff;
  bVar6 = (byte)uVar3;
  if ((int)CONCAT71(in_register_00000011,scaled) != 0) {
    uVar4 = (uVar4 >> 2) + uVar4 * 8;
    uVar5 = (uVar5 >> 4) + uVar5 * 4;
    bVar6 = (byte)((short)uVar3 << 3) | (byte)(packed_color >> 0xd);
  }
  this->m_low_color[0] = bVar6;
  this->m_low_color[1] = (uint8)uVar5;
  this->m_high_color[0] = (uint8)uVar4;
  uVar1 = 0xff;
  if (alpha < 0xff) {
    uVar1 = alpha;
  }
  uVar2 = '\0';
  if (-1 < (int)alpha) {
    uVar2 = (uint8)uVar1;
  }
  this->m_high_color[1] = uVar2;
  return (color_quad_u8)SUB84(this,0);
}

Assistant:

color_quad_u8 dxt1_block::unpack_color(uint16 packed_color, bool scaled, uint32 alpha)
    {
        uint32 b = packed_color & 31U;
        uint32 g = (packed_color >> 5U) & 63U;
        uint32 r = (packed_color >> 11U) & 31U;

        if (scaled)
        {
            b = (b << 3U) | (b >> 2U);
            g = (g << 2U) | (g >> 4U);
            r = (r << 3U) | (r >> 2U);
        }

        return color_quad_u8(r, g, b, alpha);
    }